

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion * AML::operator+(Quaternion *__return_storage_ptr__,Quaternion *lhs,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (lhs->field_0).data[1];
  dVar2 = (lhs->field_0).data[2];
  dVar3 = (lhs->field_0).data[3];
  (__return_storage_ptr__->field_0).data[0] = (lhs->field_0).data[0] + s;
  (__return_storage_ptr__->field_0).data[1] = dVar1 + s;
  (__return_storage_ptr__->field_0).data[2] = dVar2 + s;
  (__return_storage_ptr__->field_0).data[3] = s + dVar3;
  return __return_storage_ptr__;
}

Assistant:

Quaternion operator+(const Quaternion& lhs, double s) { return (Quaternion(lhs) += s); }